

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

int get_recurse_data_length
              (compiler_common *common,PCRE2_SPTR16 cc,PCRE2_SPTR16 ccend,BOOL *needs_control_head,
              BOOL *has_quit,BOOL *has_accept)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint local_6c;
  int local_60;
  BOOL control_head_found;
  BOOL capture_last_found;
  BOOL setmark_found;
  BOOL setsom_found;
  BOOL accept_found;
  BOOL quit_found;
  PCRE2_SPTR16 alternative;
  int size;
  int length;
  BOOL *has_accept_local;
  BOOL *has_quit_local;
  BOOL *needs_control_head_local;
  PCRE2_SPTR16 ccend_local;
  PCRE2_SPTR16 cc_local;
  compiler_common *common_local;
  
  alternative._4_4_ = 1;
  setsom_found = 0;
  setmark_found = 0;
  bVar3 = false;
  bVar1 = false;
  bVar2 = false;
  local_60 = 0;
  ccend_local = cc;
  while (ccend_local < ccend) {
    switch(*ccend_local) {
    case 3:
      bVar3 = true;
      ccend_local = ccend_local + 1;
      break;
    default:
      ccend_local = next_opcode(common,ccend_local);
      break;
    case 0x21:
    case 0x23:
    case 0x2e:
    case 0x30:
    case 0x3b:
    case 0x3d:
    case 0x48:
    case 0x4a:
      if (common->private_data_ptrs[(long)ccend_local - (long)common->start >> 1] != 0) {
        alternative._4_4_ = alternative._4_4_ + 2;
      }
      ccend_local = ccend_local + 2;
      break;
    case 0x22:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x2f:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x3c:
    case 0x3e:
    case 0x3f:
    case 0x40:
    case 0x49:
    case 0x4b:
    case 0x4c:
    case 0x4d:
      if (common->private_data_ptrs[(long)ccend_local - (long)common->start >> 1] != 0) {
        alternative._4_4_ = alternative._4_4_ + 1;
      }
      ccend_local = ccend_local + 2;
      break;
    case 0x27:
    case 0x28:
    case 0x34:
    case 0x35:
    case 0x41:
    case 0x42:
    case 0x4e:
    case 0x4f:
      if (common->private_data_ptrs[(long)ccend_local - (long)common->start >> 1] != 0) {
        alternative._4_4_ = alternative._4_4_ + 2;
      }
      ccend_local = ccend_local + 3;
      break;
    case 0x55:
    case 0x57:
      if (common->private_data_ptrs[(long)ccend_local - (long)common->start >> 1] != 0) {
        alternative._4_4_ = alternative._4_4_ + 2;
      }
      ccend_local = ccend_local + 1;
      break;
    case 0x56:
    case 0x58:
    case 0x59:
    case 0x5a:
      if (common->private_data_ptrs[(long)ccend_local - (long)common->start >> 1] != 0) {
        alternative._4_4_ = alternative._4_4_ + 1;
      }
      ccend_local = ccend_local + 1;
      break;
    case 0x5b:
    case 0x5c:
      if (common->private_data_ptrs[(long)ccend_local - (long)common->start >> 1] != 0) {
        alternative._4_4_ = alternative._4_4_ + 2;
      }
      ccend_local = ccend_local + 2;
      break;
    case 0x6e:
    case 0x6f:
    case 0x70:
      if (*ccend_local == 0x70) {
        local_6c = (uint)ccend_local[1];
      }
      else {
        local_6c = 0x11;
      }
      if (common->private_data_ptrs[(long)ccend_local - (long)common->start >> 1] != 0) {
        iVar4 = get_class_iterator_size(ccend_local + (int)local_6c);
        alternative._4_4_ = iVar4 + alternative._4_4_;
      }
      ccend_local = ccend_local + (int)local_6c;
      break;
    case 0x75:
      if (common->has_set_som != 0) {
        bVar3 = true;
      }
      if (common->mark_ptr != 0) {
        bVar1 = true;
      }
      if (common->capture_last_ptr != 0) {
        bVar2 = true;
      }
      ccend_local = ccend_local + 2;
      break;
    case 0x79:
      if (common->private_data_ptrs[(long)ccend_local - (long)common->start >> 1] != 0) {
        alternative._4_4_ = alternative._4_4_ + 1;
        ccend_local = ccend_local +
                      common->private_data_ptrs[(long)ccend_local + (2 - (long)common->start) >> 1];
      }
      ccend_local = ccend_local + 2;
      break;
    case 0x7e:
    case 0x7f:
    case 0x80:
    case 0x81:
    case 0x82:
    case 0x84:
    case 0x88:
    case 0x89:
    case 0x8c:
      alternative._4_4_ = alternative._4_4_ + 1;
      ccend_local = ccend_local + 2;
      break;
    case 0x85:
    case 0x8a:
      if (common->capture_last_ptr != 0) {
        bVar2 = true;
      }
      iVar4 = alternative._4_4_ + 2;
      if (common->optimized_cbracket[ccend_local[2]] == '\0') {
        iVar4 = alternative._4_4_ + 3;
      }
      alternative._4_4_ = iVar4;
      ccend_local = ccend_local + 3;
      break;
    case 0x86:
    case 0x8b:
      alternative._4_4_ = alternative._4_4_ + 4;
      if (common->capture_last_ptr != 0) {
        bVar2 = true;
      }
      ccend_local = ccend_local + 3;
      break;
    case 0x87:
      if ((ccend_local[(int)(uint)ccend_local[1]] == 0x7a) ||
         (ccend_local[(int)(uint)ccend_local[1]] == 0x7b)) {
        alternative._4_4_ = alternative._4_4_ + 1;
      }
      ccend_local = ccend_local + 2;
      break;
    case 0x96:
    case 0x98:
    case 0x9c:
    case 0x9e:
      if (!bVar1) {
        bVar1 = true;
      }
      if (common->control_head_ptr != 0) {
        local_60 = 1;
      }
      if (*ccend_local != 0x96) {
        setsom_found = 1;
      }
      ccend_local = ccend_local + (int)(ccend_local[1] + 3);
      break;
    case 0x97:
    case 0x99:
    case 0x9d:
      setsom_found = 1;
      ccend_local = ccend_local + 1;
      break;
    case 0x9a:
      setsom_found = 1;
      ccend_local = ccend_local + (int)(ccend_local[1] + 3);
      break;
    case 0x9b:
      setsom_found = 1;
      if (local_60 == 0) {
        local_60 = 1;
      }
      ccend_local = ccend_local + 1;
      break;
    case 0xa0:
    case 0xa1:
      setmark_found = 1;
      ccend_local = ccend_local + 1;
    }
  }
  if (local_60 != 0) {
    alternative._4_4_ = alternative._4_4_ + 1;
  }
  if (bVar2) {
    alternative._4_4_ = alternative._4_4_ + 1;
  }
  if (setsom_found != 0) {
    if (bVar3) {
      alternative._4_4_ = alternative._4_4_ + 1;
    }
    if (bVar1) {
      alternative._4_4_ = alternative._4_4_ + 1;
    }
  }
  *needs_control_head = local_60;
  *has_quit = setsom_found;
  *has_accept = setmark_found;
  return alternative._4_4_;
}

Assistant:

static int get_recurse_data_length(compiler_common *common, PCRE2_SPTR cc, PCRE2_SPTR ccend,
  BOOL *needs_control_head, BOOL *has_quit, BOOL *has_accept)
{
int length = 1;
int size;
PCRE2_SPTR alternative;
BOOL quit_found = FALSE;
BOOL accept_found = FALSE;
BOOL setsom_found = FALSE;
BOOL setmark_found = FALSE;
BOOL capture_last_found = FALSE;
BOOL control_head_found = FALSE;

#if defined DEBUG_FORCE_CONTROL_HEAD && DEBUG_FORCE_CONTROL_HEAD
SLJIT_ASSERT(common->control_head_ptr != 0);
control_head_found = TRUE;
#endif

/* Calculate the sum of the private machine words. */
while (cc < ccend)
  {
  size = 0;
  switch(*cc)
    {
    case OP_SET_SOM:
    SLJIT_ASSERT(common->has_set_som);
    setsom_found = TRUE;
    cc += 1;
    break;

    case OP_RECURSE:
    if (common->has_set_som)
      setsom_found = TRUE;
    if (common->mark_ptr != 0)
      setmark_found = TRUE;
    if (common->capture_last_ptr != 0)
      capture_last_found = TRUE;
    cc += 1 + LINK_SIZE;
    break;

    case OP_KET:
    if (PRIVATE_DATA(cc) != 0)
      {
      length++;
      SLJIT_ASSERT(PRIVATE_DATA(cc + 1) != 0);
      cc += PRIVATE_DATA(cc + 1);
      }
    cc += 1 + LINK_SIZE;
    break;

    case OP_ASSERT:
    case OP_ASSERT_NOT:
    case OP_ASSERTBACK:
    case OP_ASSERTBACK_NOT:
    case OP_ONCE:
    case OP_BRAPOS:
    case OP_SBRA:
    case OP_SBRAPOS:
    case OP_SCOND:
    length++;
    SLJIT_ASSERT(PRIVATE_DATA(cc) != 0);
    cc += 1 + LINK_SIZE;
    break;

    case OP_CBRA:
    case OP_SCBRA:
    length += 2;
    if (common->capture_last_ptr != 0)
      capture_last_found = TRUE;
    if (common->optimized_cbracket[GET2(cc, 1 + LINK_SIZE)] == 0)
      length++;
    cc += 1 + LINK_SIZE + IMM2_SIZE;
    break;

    case OP_CBRAPOS:
    case OP_SCBRAPOS:
    length += 2 + 2;
    if (common->capture_last_ptr != 0)
      capture_last_found = TRUE;
    cc += 1 + LINK_SIZE + IMM2_SIZE;
    break;

    case OP_COND:
    /* Might be a hidden SCOND. */
    alternative = cc + GET(cc, 1);
    if (*alternative == OP_KETRMAX || *alternative == OP_KETRMIN)
      length++;
    cc += 1 + LINK_SIZE;
    break;

    CASE_ITERATOR_PRIVATE_DATA_1
    if (PRIVATE_DATA(cc) != 0)
      length++;
    cc += 2;
#ifdef SUPPORT_UNICODE
    if (common->utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    CASE_ITERATOR_PRIVATE_DATA_2A
    if (PRIVATE_DATA(cc) != 0)
      length += 2;
    cc += 2;
#ifdef SUPPORT_UNICODE
    if (common->utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    CASE_ITERATOR_PRIVATE_DATA_2B
    if (PRIVATE_DATA(cc) != 0)
      length += 2;
    cc += 2 + IMM2_SIZE;
#ifdef SUPPORT_UNICODE
    if (common->utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    CASE_ITERATOR_TYPE_PRIVATE_DATA_1
    if (PRIVATE_DATA(cc) != 0)
      length++;
    cc += 1;
    break;

    CASE_ITERATOR_TYPE_PRIVATE_DATA_2A
    if (PRIVATE_DATA(cc) != 0)
      length += 2;
    cc += 1;
    break;

    CASE_ITERATOR_TYPE_PRIVATE_DATA_2B
    if (PRIVATE_DATA(cc) != 0)
      length += 2;
    cc += 1 + IMM2_SIZE;
    break;

    case OP_CLASS:
    case OP_NCLASS:
#if defined SUPPORT_UNICODE || PCRE2_CODE_UNIT_WIDTH != 8
    case OP_XCLASS:
    size = (*cc == OP_XCLASS) ? GET(cc, 1) : 1 + 32 / (int)sizeof(PCRE2_UCHAR);
#else
    size = 1 + 32 / (int)sizeof(PCRE2_UCHAR);
#endif
    if (PRIVATE_DATA(cc) != 0)
      length += get_class_iterator_size(cc + size);
    cc += size;
    break;

    case OP_MARK:
    case OP_COMMIT_ARG:
    case OP_PRUNE_ARG:
    case OP_THEN_ARG:
    SLJIT_ASSERT(common->mark_ptr != 0);
    if (!setmark_found)
      setmark_found = TRUE;
    if (common->control_head_ptr != 0)
      control_head_found = TRUE;
    if (*cc != OP_MARK)
      quit_found = TRUE;

    cc += 1 + 2 + cc[1];
    break;

    case OP_PRUNE:
    case OP_SKIP:
    case OP_COMMIT:
    quit_found = TRUE;
    cc++;
    break;

    case OP_SKIP_ARG:
    quit_found = TRUE;
    cc += 1 + 2 + cc[1];
    break;

    case OP_THEN:
    SLJIT_ASSERT(common->control_head_ptr != 0);
    quit_found = TRUE;
    if (!control_head_found)
      control_head_found = TRUE;
    cc++;
    break;

    case OP_ACCEPT:
    case OP_ASSERT_ACCEPT:
    accept_found = TRUE;
    cc++;
    break;

    default:
    cc = next_opcode(common, cc);
    SLJIT_ASSERT(cc != NULL);
    break;
    }
  }
SLJIT_ASSERT(cc == ccend);

if (control_head_found)
  length++;
if (capture_last_found)
  length++;
if (quit_found)
  {
  if (setsom_found)
    length++;
  if (setmark_found)
    length++;
  }

*needs_control_head = control_head_found;
*has_quit = quit_found;
*has_accept = accept_found;
return length;
}